

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Remote.cpp
# Opt level: O3

void XPMP2::RmtSendMain(void)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  NetRuntimeError *pNVar5;
  XPMP2Error *this;
  UDPMulticast *this_00;
  int iVar6;
  long lVar7;
  string from;
  fd_set sRead;
  string local_d8;
  string local_b8;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  if (glob < 1) {
    LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/XPMP2/src/Remote.cpp"
           ,0x2ad,"RmtSendMain",logDEBUG,"Sender thread started");
  }
  this_00 = gpMc;
  do {
    if (this_00 == (UDPMulticast *)0x0) {
      this = (XPMP2Error *)__cxa_allocate_exception(0x78);
      XPMP2Error::XPMP2Error
                (this,
                 "/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/XPMP2/src/Remote.cpp"
                 ,0x2b2,"RmtSendMain","ASSERT FAILED: %s","gpMc != nullptr");
      __cxa_throw(this,&XPMP2Error::typeinfo,XPMP2Error::~XPMP2Error);
    }
    DAT_002ec77c = 1;
    UDPMulticast::Join(this_00,(string *)&DAT_002ec718,DAT_002ec738,(string *)&DAT_002ec740,
                       DAT_002ec760,DAT_002ec768,0);
    iVar6 = (gpMc->super_SocketNetworking).f_socket;
    iVar3 = pipe(&gSelfPipe);
    if (iVar3 < 0) {
      pNVar5 = (NetRuntimeError *)__cxa_allocate_exception(0x50);
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b8,"Couldn\'t create self-pipe","");
      NetRuntimeError::NetRuntimeError(pNVar5,&local_b8);
      __cxa_throw(pNVar5,&NetRuntimeError::typeinfo,NetRuntimeError::~NetRuntimeError);
    }
    fcntl(gSelfPipe,4,0x800);
    iVar6 = iVar6 + 1;
    iVar3 = gSelfPipe + 1;
    if (gSelfPipe + 1 < iVar6) {
      iVar3 = iVar6;
    }
    if (glob < 2) {
      LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/XPMP2/src/Remote.cpp"
             ,0x2c5,"RmtSendMain",logINFO,
             "Listening to %s, waiting for someone being interested in our data...",
             (gpMc->multicastAddr)._M_dataplus._M_p);
    }
    if (gbStopMCThread == '\0') {
      do {
        do {
          if (((1 < DAT_002ec77c - 1U) || (gpMc == (UDPMulticast *)0x0)) ||
             (iVar6 = (gpMc->super_SocketNetworking).f_socket, iVar6 == -1)) goto LAB_00235629;
          local_48 = 0;
          uStack_40 = 0;
          local_58 = 0;
          uStack_50 = 0;
          local_68 = 0;
          uStack_60 = 0;
          local_78 = 0;
          uStack_70 = 0;
          local_88 = 0;
          uStack_80 = 0;
          local_98 = 0;
          uStack_90 = 0;
          local_b8.field_2._M_allocated_capacity = 0;
          local_b8.field_2._8_8_ = 0;
          local_b8._M_dataplus._M_p = (pointer)0x0;
          local_b8._M_string_length = 0;
          iVar2 = iVar6 + 0x3f;
          if (-1 < iVar6) {
            iVar2 = iVar6;
          }
          (&local_b8._M_dataplus)[iVar2 >> 6]._M_p =
               (pointer)((ulong)(&local_b8._M_dataplus)[iVar2 >> 6]._M_p |
                        1L << ((byte)iVar6 & 0x3f));
          iVar6 = gSelfPipe + 0x3f;
          if (-1 < gSelfPipe) {
            iVar6 = gSelfPipe;
          }
          (&local_b8._M_dataplus)[iVar6 >> 6]._M_p =
               (pointer)((ulong)(&local_b8._M_dataplus)[iVar6 >> 6]._M_p |
                        1L << ((byte)(gSelfPipe % 0x40) & 0x3f));
          iVar6 = select(iVar3,(fd_set *)&local_b8,(fd_set *)0x0,(fd_set *)0x0,(timeval *)0x0);
          if (((gbStopMCThread != '\0') || (1 < DAT_002ec77c - 1U)) || (gpMc == (UDPMulticast *)0x0)
             ) goto LAB_00235629;
          uVar1 = (gpMc->super_SocketNetworking).f_socket;
          if (uVar1 == 0xffffffff) goto LAB_00235629;
          if (iVar6 == -1) {
            pNVar5 = (NetRuntimeError *)__cxa_allocate_exception(0x50);
            local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_d8,"\'select\' failed","");
            NetRuntimeError::NetRuntimeError(pNVar5,&local_d8);
            __cxa_throw(pNVar5,&NetRuntimeError::typeinfo,NetRuntimeError::~NetRuntimeError);
          }
        } while (iVar6 < 1);
        uVar4 = uVar1 + 0x3f;
        if (-1 < (int)uVar1) {
          uVar4 = uVar1;
        }
      } while (((ulong)(&local_b8._M_dataplus)[(int)uVar4 >> 6]._M_p >> ((ulong)uVar1 & 0x3f) & 1)
               == 0);
      local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
      local_d8._M_string_length = 0;
      local_d8.field_2._M_local_buf[0] = '\0';
      UDPMulticast::RecvMC(gpMc,true,&local_d8,(SockAddrTy *)0x0,(bool *)0x0);
      if (glob < 2) {
        LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/XPMP2/src/Remote.cpp"
               ,0x2e4,"RmtSendMain",logINFO,
               "Received word from %s, will start sending aircraft data",local_d8._M_dataplus._M_p);
      }
      DAT_002ec77c = 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p,
                        CONCAT71(local_d8.field_2._M_allocated_capacity._1_7_,
                                 local_d8.field_2._M_local_buf[0]) + 1);
      }
    }
LAB_00235629:
    lVar7 = 0;
    do {
      if (*(int *)((long)&gSelfPipe + lVar7) != -1) {
        close(*(int *)((long)&gSelfPipe + lVar7));
      }
      *(undefined4 *)((long)&gSelfPipe + lVar7) = 0xffffffff;
      lVar7 = lVar7 + 4;
    } while (lVar7 != 8);
    if (((gbStopMCThread == '\0') && (DAT_002ec77c - 1U < 2 && gpMc != (UDPMulticast *)0x0)) &&
       ((gpMc->super_SocketNetworking).f_socket != -1)) {
      RmtSendLoop();
    }
    if (gpMc == (UDPMulticast *)0x0) {
      this_00 = (UDPMulticast *)0x0;
    }
    else {
      (*(gpMc->super_SocketNetworking)._vptr_SocketNetworking[4])();
      this_00 = gpMc;
    }
    if (gbStopMCThread == '\x01') {
      DAT_002ec77c = 0;
      gbStopMCThread = '\x01';
      if (glob < 1) {
        LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/XPMP2/src/Remote.cpp"
               ,0x313,"RmtSendMain",logDEBUG,"Sender thread stopping");
      }
      return;
    }
  } while( true );
}

Assistant:

void RmtSendMain()
{
    // This is a thread main function, set thread's name
    SET_THREAD_NAME("XPMP2_Send");
    LOG_MSG(logDEBUG, "Sender thread started");
    int cntMCErr = 0;                       ///< error counter for network thread
    
    do {
        try {
            LOG_ASSERT(gpMc != nullptr);
            
            // Set global status to: we are "waiting" for some action on the multicast group
            glob.remoteStatus = REMOTE_SEND_WAITING;
            
            // Create a multicast socket and listen if there is any traffic in our multicast group
            gpMc->Join(glob.remoteMCGroup, glob.remotePort, glob.remoteSendIntf,
                       glob.remoteTTL, glob.remoteBufSize);
            int maxSock = (int)gpMc->getSocket() + 1;
#if APL == 1 || LIN == 1
            // the self-pipe to shut down the TCP socket gracefully
            if (pipe(gSelfPipe) < 0)
                throw NetRuntimeError("Couldn't create self-pipe");
            fcntl(gSelfPipe[0], F_SETFL, O_NONBLOCK);
            maxSock = std::max(maxSock, gSelfPipe[0]+1);
#endif
            
            // *** Main listening loop ***
            
            LOG_MSG(logINFO, INFO_MC_SEND_WAIT, gpMc->GetMCAddr().c_str());
            
            while (RmtSendContinue())
            {
                // wait for some signal on either socket (multicast or self-pipe)
                fd_set sRead;
                FD_ZERO(&sRead);
                FD_SET(gpMc->getSocket(), &sRead);      // check our socket
#if APL == 1 || LIN == 1
                FD_SET(gSelfPipe[0], &sRead);        // check the self-pipe
#endif
                int retval = select(maxSock, &sRead, NULL, NULL, NULL);
                
                // short-cut if we are to shut down (return from 'select' due to closed socket)
                if (!RmtSendContinue())
                    break;
                
                // select call failed???
                if (retval == -1)
                    throw NetRuntimeError("'select' failed");
                
                // select successful - there is multicast data!
                if (retval > 0 && FD_ISSET(gpMc->getSocket(), &sRead))
                {
                    // We aren't actually interested in the data as such,
                    // the fact that there was _any_ traffic already means:
                    // there is someone out there interested in our data.
                    // We just read received multicast to clear out the buffers
                    // and switch the sending interface to the interface we received from.
                    std::string from;
                    gpMc->RecvMC(true, &from);
                    LOG_MSG(logINFO, INFO_MC_SEND_RCVD, from.c_str());
                    
                    // Set global status to: we are about to send data, also exits listening loop
                    glob.remoteStatus = REMOTE_SENDING;
                    break;
                }
            }
            
#if APL == 1 || LIN == 1
            // close the self-pipe sockets
            for (SOCKET &s: gSelfPipe) {
                if (s != INVALID_SOCKET) close(s);
                s = INVALID_SOCKET;
            }
#endif
            // Continue? Then send data!
            if (RmtSendContinue())
                RmtSendLoop();
        }
        catch (std::exception& e) {
            ++cntMCErr;
            LOG_MSG(logERR, ERR_MC_THREAD, e.what());
            
#if APL == 1 || LIN == 1
            // close the self-pipe sockets
            for (SOCKET &s: gSelfPipe) {
                if (s != INVALID_SOCKET) close(s);
                s = INVALID_SOCKET;
            }
#endif
        }
        
        // close the multicast socket
        if (gpMc)
            gpMc->Close();
        
        // Error count too high?
        if (cntMCErr >= MC_MAX_ERR) {
            LOG_MSG(logFATAL, ERR_MC_MAX);
            gbRemoteGaveUp = true;          // the SENDER gives up after too many errors
        }
    }
    while (!gbStopMCThread && cntMCErr < MC_MAX_ERR);
        
    // make sure the end of the thread is recognized and joined
    glob.remoteStatus = REMOTE_OFF;
    gbStopMCThread = true;
    LOG_MSG(logDEBUG, "Sender thread stopping");
}